

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O2

void __thiscall perfetto::protos::pbzero::TrackEvent::set_name(TrackEvent *this,string *value)

{
  protozero::internal::FieldWriter<(protozero::proto_utils::ProtoSchemaType)9>::Append
            (&this->super_Message,0x17,value);
  return;
}

Assistant:

void set_name(std::string value) {
    static constexpr uint32_t field_id = FieldMetadata_Name::kFieldId;
    // Call the appropriate protozero::Message::Append(field_id, ...)
    // method based on the type of the field.
    ::protozero::internal::FieldWriter<
      ::protozero::proto_utils::ProtoSchemaType::kString>
        ::Append(*this, field_id, value);
  }